

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsView::sceneRect(QGraphicsView *this)

{
  bool bVar1;
  QGraphicsViewPrivate *pQVar2;
  QGraphicsScene *in_RSI;
  QRectF *in_RDI;
  QGraphicsViewPrivate *d;
  
  pQVar2 = d_func((QGraphicsView *)0xa322e1);
  if ((*(uint *)&pQVar2->field_0x300 >> 1 & 1) == 0) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa32343);
    if (bVar1) {
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa3235a);
      QGraphicsScene::sceneRect(in_RSI);
    }
    else {
      QRectF::QRectF(in_RDI);
    }
  }
  else {
    in_RDI->xp = (pQVar2->sceneRect).xp;
    in_RDI->yp = (pQVar2->sceneRect).yp;
    in_RDI->w = (pQVar2->sceneRect).w;
    in_RDI->h = (pQVar2->sceneRect).h;
  }
  return in_RDI;
}

Assistant:

QRectF QGraphicsView::sceneRect() const
{
    Q_D(const QGraphicsView);
    if (d->hasSceneRect)
        return d->sceneRect;
    if (d->scene)
        return d->scene->sceneRect();
    return QRectF();
}